

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DExporter::X3DExporter
          (X3DExporter *this,char *pFileName,IOSystem *pIOSystem,aiScene *pScene,
          ExportProperties *param_4)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  DeadlyImportError *this_00;
  allocator<char> local_a9;
  undefined1 local_a8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  
  this->mScene = pScene;
  p_Var1 = &(this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header;
  (this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header;
  (this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mIndentationString)._M_dataplus._M_p = (pointer)&(this->mIndentationString).field_2;
  (this->mIndentationString)._M_string_length = 0;
  (this->mIndentationString).field_2._M_local_buf[0] = '\0';
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&attr_list;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node._M_size = 0;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       attr_list.
       super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  iVar2 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFileName,"wt");
  this->mOutFile = (IOStream *)CONCAT44(extraout_var,iVar2);
  if ((IOStream *)CONCAT44(extraout_var,iVar2) != (IOStream *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",
               (allocator<char> *)&local_68);
    XML_Write(this,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,
               "<!DOCTYPE X3D PUBLIC \"ISO//Web3D//DTD X3D 3.3//EN\" \"http://www.web3d.org/specifications/x3d-3.3.dtd\">\n"
               ,(allocator<char> *)&local_68);
    XML_Write(this,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"profile",(allocator<char> *)&local_68);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_a8 + 0x20),"Interchange",&local_a9);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back(&attr_list,(value_type *)local_a8);
    SAttribute::~SAttribute((SAttribute *)local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"version",(allocator<char> *)&local_68);
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_a8 + 0x20),"3.3",&local_a9);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back(&attr_list,(value_type *)local_a8);
    SAttribute::~SAttribute((SAttribute *)local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"xmlns:xsd",(allocator<char> *)&local_68);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_a8 + 0x20),"http://www.w3.org/2001/XMLSchema-instance",&local_a9);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back(&attr_list,(value_type *)local_a8);
    SAttribute::~SAttribute((SAttribute *)local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"xsd:noNamespaceSchemaLocation",(allocator<char> *)&local_68);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_a8 + 0x20),"http://www.web3d.org/specifications/x3d-3.3.xsd",
               &local_a9);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back(&attr_list,(value_type *)local_a8);
    SAttribute::~SAttribute((SAttribute *)local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"X3D",(allocator<char> *)&local_68);
    NodeHelper_OpenNode(this,(string *)local_a8,0,false,&attr_list);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
              (&attr_list);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"head",(allocator<char> *)&local_68);
    NodeHelper_OpenNode(this,(string *)local_a8,1,false);
    std::__cxx11::string::~string((string *)local_a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   &this->mIndentationString,
                   "<!-- All \"meta\" from this section tou will found in <Scene> node as MetadataString nodes. -->\n"
                  );
    XML_Write(this,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"head",(allocator<char> *)&local_68);
    NodeHelper_CloseNode(this,(string *)local_a8,1);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"Scene",(allocator<char> *)&local_68);
    NodeHelper_OpenNode(this,(string *)local_a8,1,false);
    std::__cxx11::string::~string((string *)local_a8);
    Export_Node(this,this->mScene->mRootNode,2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"Scene",(allocator<char> *)&local_68);
    NodeHelper_CloseNode(this,(string *)local_a8,1);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"X3D",(allocator<char> *)&local_68);
    NodeHelper_CloseNode(this,(string *)local_a8,0);
    std::__cxx11::string::~string((string *)local_a8);
    (*pIOSystem->_vptr_IOSystem[5])(pIOSystem,this->mOutFile);
    this->mOutFile = (IOStream *)0x0;
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&attr_list.
              super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            );
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pFileName,&local_a9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 "Could not open output .x3d file: ",&local_68);
  DeadlyImportError::DeadlyImportError(this_00,(string *)local_a8);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

X3DExporter::X3DExporter(const char* pFileName, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/)
	: mScene(pScene)
{
list<SAttribute> attr_list;

	mOutFile = pIOSystem->Open(pFileName, "wt");
	if(mOutFile == nullptr) throw DeadlyExportError("Could not open output .x3d file: " + string(pFileName));

	// Begin document
	XML_Write("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
	XML_Write("<!DOCTYPE X3D PUBLIC \"ISO//Web3D//DTD X3D 3.3//EN\" \"http://www.web3d.org/specifications/x3d-3.3.dtd\">\n");
	// Root node
	attr_list.push_back({"profile", "Interchange"});
	attr_list.push_back({"version", "3.3"});
	attr_list.push_back({"xmlns:xsd", "http://www.w3.org/2001/XMLSchema-instance"});
	attr_list.push_back({"xsd:noNamespaceSchemaLocation", "http://www.web3d.org/specifications/x3d-3.3.xsd"});
	NodeHelper_OpenNode("X3D", 0, false, attr_list);
	attr_list.clear();
	// <head>: meta data.
	NodeHelper_OpenNode("head", 1);
	XML_Write(mIndentationString + "<!-- All \"meta\" from this section tou will found in <Scene> node as MetadataString nodes. -->\n");
	NodeHelper_CloseNode("head", 1);
	// Scene node.
	NodeHelper_OpenNode("Scene", 1);
	Export_Node(mScene->mRootNode, 2);
	NodeHelper_CloseNode("Scene", 1);
	// Close Root node.
	NodeHelper_CloseNode("X3D", 0);
	// Cleanup
	pIOSystem->Close(mOutFile);
	mOutFile = nullptr;
}